

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int ConversionFile(path *source,path *destination,bool use_second_side)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  FormatType *pFVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  uint uVar7;
  char *__s;
  IDisk *new_disk;
  IDisk *new_disk_side_2;
  FormatType *format;
  DiskBuilder disk_builder;
  IDisk *local_a0;
  IDisk *local_98;
  FormatType *local_90;
  path local_88;
  DiskBuilder local_48;
  
  DiskBuilder::DiskBuilder(&local_48);
  if ((destination->_M_pathname)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)destination);
    std::
    vector<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ::operator=(&destination->_M_cmpts,&source->_M_cmpts);
    destination->_M_type = source->_M_type;
    std::experimental::filesystem::v1::__cxx11::path::
    path<char[1],std::experimental::filesystem::v1::__cxx11::path>(&local_88,(char (*) [1])0x16b9bb)
    ;
    std::experimental::filesystem::v1::__cxx11::path::replace_extension(destination,&local_88);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_88);
  }
  std::experimental::filesystem::v1::__cxx11::path::
  generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_88._M_pathname,source,(allocator<char> *)&local_90);
  paVar1 = &local_88._M_pathname.field_2;
  printf("Loading %s",local_88._M_pathname._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_pathname._M_dataplus._M_p,
                    local_88._M_pathname.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (source->_M_pathname)._M_dataplus._M_p;
  local_88._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_88,pcVar2,pcVar2 + (source->_M_pathname)._M_string_length);
  bVar4 = DiskBuilder::CanLoad(&local_48,local_88._M_pathname._M_dataplus._M_p,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_pathname._M_dataplus._M_p,
                    local_88._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    local_a0 = (IDisk *)0x0;
    pcVar2 = (source->_M_pathname)._M_dataplus._M_p;
    local_88._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_88,pcVar2,pcVar2 + (source->_M_pathname)._M_string_length);
    iVar5 = DiskBuilder::LoadDisk
                      (&local_48,local_88._M_pathname._M_dataplus._M_p,&local_a0,
                       (ILoadingProgress *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_pathname._M_dataplus._M_p,
                      local_88._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 == 0) {
      printf(" ok - ");
      local_98 = (IDisk *)0x0;
      if ((use_second_side) && (*second_side != '\0')) {
        bVar4 = DiskBuilder::CanLoad(&local_48,second_side,&local_90);
        if (bVar4) {
          iVar5 = DiskBuilder::LoadDisk(&local_48,second_side,&local_98,(ILoadingProgress *)0x0);
          if (iVar5 == 0) {
            printf(" ok - ");
            goto LAB_0012ae0e;
          }
          __s = " !! Error loading disk 2 !!";
        }
        else {
          __s = " !! Error loading disk 2 : Format unknown !!";
        }
      }
      else {
LAB_0012ae0e:
        iVar5 = (**local_90->_vptr_FormatType)();
        iVar5 = strcmp((char *)CONCAT44(extraout_var,iVar5),"KRYOFLUX");
        iVar6 = (*local_a0->_vptr_IDisk[2])(local_a0,(ulong)face_to_convert);
        if (iVar6 - 1U < 3) {
          printf(&DAT_0016a89c + *(int *)(&DAT_0016a89c + (ulong)(iVar6 - 1U) * 4));
          if (local_98 != (IDisk *)0x0) {
            (*local_a0->_vptr_IDisk[7])();
            if (local_98 != (IDisk *)0x0) {
              (*local_98->_vptr_IDisk[1])();
            }
          }
          pFVar3 = out_support;
          pcVar2 = (destination->_M_pathname)._M_dataplus._M_p;
          local_88._M_pathname._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_88,pcVar2,pcVar2 + (destination->_M_pathname)._M_string_length
                    );
          (*pFVar3->_vptr_FormatType[9])(pFVar3,local_88._M_pathname._M_dataplus._M_p,local_a0,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_pathname._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_pathname._M_dataplus._M_p,
                            local_88._M_pathname.field_2._M_allocated_capacity + 1);
          }
          uVar7 = (uint)(iVar5 == 0);
          printf("Saving %s \n",(local_a0->current_disk_path_)._M_dataplus._M_p);
          goto LAB_0012ad75;
        }
        __s = " !! Error selecting side";
      }
    }
    else {
      __s = " !! Error loading disk !!";
    }
  }
  else {
    __s = " !! Error loading disk : Format unknown !!";
  }
  puts(__s);
  uVar7 = 0xffffffff;
LAB_0012ad75:
  DiskBuilder::~DiskBuilder(&local_48);
  return uVar7;
}

Assistant:

int ConversionFile(fs::path& source, fs::path& destination, bool use_second_side)
{
   DiskBuilder disk_builder;
   int return_value = 0;

   ////////////////////////////////////
   // Destination
   if (destination.empty())
   {
      // take source, remove file spec
      destination = source;
      destination.replace_extension("");
   }

   printf("Loading %s", source.generic_string().c_str());

   FormatType* format;
   if (!disk_builder.CanLoad(source.string().c_str(), format) )
   {
      printf(" !! Error loading disk : Format unknown !!\n");
      return -1;
   }

   // Load the disk - todo : add progression 
   IDisk* new_disk = nullptr;
   if (disk_builder.LoadDisk(source.string().c_str(), new_disk, nullptr) != 0)
   {
      printf(" !! Error loading disk !!\n");
      return -1;
   }
   else
   {
      printf(" ok - ");
   }

   // Second side foring ?
   IDisk* new_disk_side_2 = nullptr;
   if (use_second_side && strlen(second_side) > 0)
   {
      if (!disk_builder.CanLoad(second_side, format))
      {
         printf(" !! Error loading disk 2 : Format unknown !!\n");
         return -1;
      }

      // Load the disk - todo : add progression 
      if (disk_builder.LoadDisk(second_side, new_disk_side_2, nullptr) != 0)
      {
         printf(" !! Error loading disk 2 !!\n");
         return -1;
      }
      else
      {
         printf(" ok - ");
      }
   }

   // raw ?
   if (strcmp(format->GetFormatName(), "KRYOFLUX") == 0)
   {
      return_value = 1;
   }

   // Filter side
   IDisk::FaceSelection pSide = new_disk->FilterSide(face_to_convert);
   switch (pSide)
   {
   case IDisk::FaceSelection::FACE_1: printf("Side 0 is kept - ");
      break;
   case IDisk::FaceSelection::FACE_2: printf("Side 1 is kept - ");
      break;
   case IDisk::FaceSelection::FACE_BOTH: printf("Both Sides are kept - ");
      break;
   default:
      printf(" !! Error selecting side\n");
      return -1;
   }

   // Combine the 2 dumps, if necessary
   if (new_disk_side_2 != nullptr)
   {
      // Combine both disk      
      new_disk->CombineWithDisk(new_disk_side_2);
      delete new_disk_side_2;
   }


   // Save with the correct format
   out_support->SaveDisk(destination.string().c_str(), new_disk);
   printf("Saving %s \n", new_disk->GetCurrentLoadedDisk());

   return return_value;
}